

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O3

void ppMul2(word *c,word *a,word *b,void *stack)

{
  word wVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  *(undefined8 *)stack = 0;
  wVar1 = *a;
  *(word *)((long)stack + 8) = wVar1;
  *(word *)((long)stack + 0x10) = wVar1 * 2;
  uVar3 = wVar1 * 2 ^ *a;
  *(ulong *)((long)stack + 0x18) = uVar3;
  *(word *)((long)stack + 0x20) = wVar1 * 4;
  uVar4 = wVar1 * 4 ^ *a;
  *(ulong *)((long)stack + 0x28) = uVar4;
  *(ulong *)((long)stack + 0x30) = uVar3 * 2;
  uVar5 = uVar3 * 2 ^ *a;
  *(ulong *)((long)stack + 0x38) = uVar5;
  *(word *)((long)stack + 0x40) = wVar1 << 3;
  *(word *)((long)stack + 0x48) = wVar1 << 3 ^ *a;
  uVar4 = uVar4 * 2;
  *(ulong *)((long)stack + 0x50) = uVar4;
  *(ulong *)((long)stack + 0x58) = uVar4 ^ *a;
  *(ulong *)((long)stack + 0x60) = uVar3 << 2;
  *(ulong *)((long)stack + 0x68) = uVar3 << 2 ^ *a;
  uVar5 = uVar5 * 2;
  *(ulong *)((long)stack + 0x70) = uVar5;
  *(ulong *)((long)stack + 0x78) = uVar5 ^ *a;
  uVar4 = *(long *)((long)stack + (*b >> 0x3c) * 8) << 4 ^
          *(ulong *)((long)stack + (ulong)((byte)(*b >> 0x38) & 0xf) * 8);
  *c = uVar4;
  c[1] = uVar4 >> 0x38;
  uVar5 = *(long *)((long)stack + (ulong)((uint)(*b >> 0x34) & 0xf) * 8) << 4 ^ uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)((ushort)(*b >> 0x30) & 0xf) * 8);
  *c = uVar5;
  uVar4 = (uVar4 >> 0x38) << 8 | uVar5 >> 0x38;
  c[1] = uVar4;
  uVar2 = (uint)(*b >> 0x20);
  uVar5 = *(long *)((long)stack + (ulong)(uVar2 >> 0xc & 0xf) * 8) << 4 ^ uVar5 << 8 ^
          *(ulong *)((long)stack + (ulong)(uVar2 >> 8 & 0xf) * 8);
  *c = uVar5;
  uVar4 = uVar4 << 8 | uVar5 >> 0x38;
  c[1] = uVar4;
  uVar2 = (uint)(*b >> 0x20);
  uVar5 = *(long *)((long)stack + (ulong)(uVar2 >> 4 & 0xf) * 8) << 4 ^ uVar5 << 8 ^
          *(ulong *)((long)stack + (ulong)(uVar2 & 0xf) * 8);
  *c = uVar5;
  uVar4 = uVar4 << 8 | uVar5 >> 0x38;
  c[1] = uVar4;
  uVar5 = *(long *)((long)stack + (ulong)((uint)*b >> 0x1c) * 8) << 4 ^ uVar5 << 8 ^
          *(ulong *)((long)stack + (ulong)((uint)*b >> 0x15 & 0x78));
  *c = uVar5;
  uVar4 = uVar4 << 8 | uVar5 >> 0x38;
  c[1] = uVar4;
  uVar5 = *(long *)((long)stack + (ulong)((uint)*b >> 0x11 & 0x78)) << 4 ^ uVar5 << 8 ^
          *(ulong *)((long)stack + (ulong)((uint)*b >> 0xd & 0x78));
  *c = uVar5;
  uVar4 = uVar4 << 8 | uVar5 >> 0x38;
  c[1] = uVar4;
  uVar5 = *(long *)((long)stack + (ulong)((uint)*b >> 9 & 0x78)) << 4 ^ uVar5 << 8 ^
          *(ulong *)((long)stack + (ulong)((uint)*b >> 5 & 0x78));
  *c = uVar5;
  uVar4 = uVar4 << 8 | uVar5 >> 0x38;
  c[1] = uVar4;
  *c = *(long *)((long)stack + (ulong)((uint)*b >> 1 & 0x78)) << 4 ^ uVar5 << 8 ^
       *(ulong *)((long)stack + (ulong)((uint)*b & 0xf) * 8);
  uVar4 = (long)*a >> 0x3f & *b >> 1 & 0x7f7f7f7f7f7f7f7f ^ uVar4;
  c[1] = uVar4;
  uVar4 = *b >> 2 & 0x3f3f3f3f3f3f3f3f & (long)(*a * 2) >> 0x3f ^ uVar4;
  c[1] = uVar4;
  uVar4 = *b >> 3 & 0x1f1f1f1f1f1f1f1f & (long)(*a << 2) >> 0x3f ^ uVar4;
  c[1] = uVar4;
  uVar4 = *b >> 4 & 0xf0f0f0f0f0f0f0f & (long)(*a << 3) >> 0x3f ^ uVar4;
  c[1] = uVar4;
  uVar4 = *b >> 5 & 0x707070707070707 & (long)(*a << 4) >> 0x3f ^ uVar4;
  c[1] = uVar4;
  uVar4 = *b >> 6 & 0x303030303030303 & (long)(*a << 5) >> 0x3f ^ uVar4;
  c[1] = uVar4;
  c[1] = *b >> 7 & 0x101010101010101 & (long)(*a << 6) >> 0x3f ^ uVar4;
  *(undefined8 *)stack = 0;
  wVar1 = a[1];
  *(word *)((long)stack + 8) = wVar1;
  *(word *)((long)stack + 0x10) = wVar1 * 2;
  uVar3 = wVar1 * 2 ^ a[1];
  *(ulong *)((long)stack + 0x18) = uVar3;
  *(word *)((long)stack + 0x20) = wVar1 * 4;
  uVar4 = wVar1 * 4 ^ a[1];
  *(ulong *)((long)stack + 0x28) = uVar4;
  *(ulong *)((long)stack + 0x30) = uVar3 * 2;
  uVar5 = uVar3 * 2 ^ a[1];
  *(ulong *)((long)stack + 0x38) = uVar5;
  *(word *)((long)stack + 0x40) = wVar1 << 3;
  *(word *)((long)stack + 0x48) = wVar1 << 3 ^ a[1];
  uVar4 = uVar4 * 2;
  *(ulong *)((long)stack + 0x50) = uVar4;
  *(ulong *)((long)stack + 0x58) = uVar4 ^ a[1];
  *(ulong *)((long)stack + 0x60) = uVar3 << 2;
  *(ulong *)((long)stack + 0x68) = uVar3 << 2 ^ a[1];
  uVar5 = uVar5 * 2;
  *(ulong *)((long)stack + 0x70) = uVar5;
  *(ulong *)((long)stack + 0x78) = uVar5 ^ a[1];
  uVar5 = *(long *)((long)stack + (b[1] >> 0x3c) * 8) << 4 ^
          *(ulong *)((long)stack + (ulong)((byte)(b[1] >> 0x38) & 0xf) * 8);
  c[2] = uVar5;
  c[3] = uVar5 >> 0x38;
  uVar4 = *(long *)((long)stack + (ulong)((uint)(b[1] >> 0x34) & 0xf) * 8) << 4 ^ uVar5 << 8 ^
          *(ulong *)((long)stack + (ulong)((ushort)(b[1] >> 0x30) & 0xf) * 8);
  c[2] = uVar4;
  uVar5 = (uVar5 >> 0x38) << 8 | uVar4 >> 0x38;
  c[3] = uVar5;
  uVar2 = (uint)(b[1] >> 0x20);
  uVar4 = *(long *)((long)stack + (ulong)(uVar2 >> 0xc & 0xf) * 8) << 4 ^ uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)(uVar2 >> 8 & 0xf) * 8);
  c[2] = uVar4;
  uVar5 = uVar5 << 8 | uVar4 >> 0x38;
  c[3] = uVar5;
  uVar2 = (uint)(b[1] >> 0x20);
  uVar4 = *(long *)((long)stack + (ulong)(uVar2 >> 4 & 0xf) * 8) << 4 ^ uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)(uVar2 & 0xf) * 8);
  c[2] = uVar4;
  uVar5 = uVar5 << 8 | uVar4 >> 0x38;
  c[3] = uVar5;
  uVar4 = *(long *)((long)stack + (ulong)((uint)b[1] >> 0x1c) * 8) << 4 ^ uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)((uint)b[1] >> 0x15 & 0x78));
  c[2] = uVar4;
  uVar5 = uVar5 << 8 | uVar4 >> 0x38;
  c[3] = uVar5;
  uVar4 = *(long *)((long)stack + (ulong)((uint)b[1] >> 0x11 & 0x78)) << 4 ^ uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)((uint)b[1] >> 0xd & 0x78));
  c[2] = uVar4;
  uVar5 = uVar5 << 8 | uVar4 >> 0x38;
  c[3] = uVar5;
  uVar4 = *(long *)((long)stack + (ulong)((uint)b[1] >> 9 & 0x78)) << 4 ^ uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)((uint)b[1] >> 5 & 0x78));
  c[2] = uVar4;
  uVar5 = uVar5 << 8 | uVar4 >> 0x38;
  c[3] = uVar5;
  uVar4 = *(long *)((long)stack + (ulong)((uint)b[1] >> 1 & 0x78)) << 4 ^ uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)((uint)b[1] & 0xf) * 8);
  c[2] = uVar4;
  uVar5 = (long)a[1] >> 0x3f & b[1] >> 1 & 0x7f7f7f7f7f7f7f7f ^ uVar5;
  c[3] = uVar5;
  uVar5 = b[1] >> 2 & 0x3f3f3f3f3f3f3f3f & (long)(a[1] * 2) >> 0x3f ^ uVar5;
  c[3] = uVar5;
  uVar5 = b[1] >> 3 & 0x1f1f1f1f1f1f1f1f & (long)(a[1] << 2) >> 0x3f ^ uVar5;
  c[3] = uVar5;
  uVar5 = b[1] >> 4 & 0xf0f0f0f0f0f0f0f & (long)(a[1] << 3) >> 0x3f ^ uVar5;
  c[3] = uVar5;
  uVar5 = b[1] >> 5 & 0x707070707070707 & (long)(a[1] << 4) >> 0x3f ^ uVar5;
  c[3] = uVar5;
  uVar5 = b[1] >> 6 & 0x303030303030303 & (long)(a[1] << 5) >> 0x3f ^ uVar5;
  c[3] = uVar5;
  c[3] = b[1] >> 7 & 0x101010101010101 & (long)(a[1] << 6) >> 0x3f ^ uVar5;
  *(ulong *)stack = uVar4 ^ c[1];
  *(undefined8 *)((long)stack + 8) = 0;
  uVar3 = a[1] ^ *a;
  *(ulong *)((long)stack + 0x10) = uVar3;
  *(ulong *)((long)stack + 0x18) = uVar3 * 2;
  uVar6 = *a ^ a[1] ^ uVar3 * 2;
  *(ulong *)((long)stack + 0x20) = uVar6;
  *(ulong *)((long)stack + 0x28) = uVar3 * 4;
  uVar4 = *a ^ a[1] ^ uVar3 * 4;
  *(ulong *)((long)stack + 0x30) = uVar4;
  *(ulong *)((long)stack + 0x38) = uVar6 * 2;
  uVar5 = *a ^ a[1] ^ uVar6 * 2;
  *(ulong *)((long)stack + 0x40) = uVar5;
  *(ulong *)((long)stack + 0x48) = uVar3 << 3;
  *(word *)((long)stack + 0x50) = *a ^ a[1] ^ uVar3 << 3;
  uVar4 = uVar4 * 2;
  *(ulong *)((long)stack + 0x58) = uVar4;
  *(word *)((long)stack + 0x60) = *a ^ a[1] ^ uVar4;
  *(ulong *)((long)stack + 0x68) = uVar6 << 2;
  *(word *)((long)stack + 0x70) = *a ^ a[1] ^ uVar6 << 2;
  uVar5 = uVar5 * 2;
  *(ulong *)((long)stack + 0x78) = uVar5;
  *(word *)((long)stack + 0x80) = *a ^ a[1] ^ uVar5;
  uVar4 = *(long *)((long)stack + ((b[1] ^ *b) >> 0x3c) * 8 + 8) << 4 ^
          *(ulong *)((long)stack + (ulong)((byte)((b[1] ^ *b) >> 0x38) & 0xf) * 8 + 8);
  c[1] = uVar4;
  c[2] = uVar4 >> 0x38;
  uVar5 = *(long *)((long)stack + (ulong)((uint)((b[1] ^ *b) >> 0x34) & 0xf) * 8 + 8) << 4 ^
          uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)((ushort)((b[1] ^ *b) >> 0x30) & 0xf) * 8 + 8);
  c[1] = uVar5;
  uVar3 = (uVar4 >> 0x38) << 8 | uVar5 >> 0x38;
  c[2] = uVar3;
  uVar2 = (uint)(b[1] >> 0x20) ^ (uint)(*b >> 0x20);
  uVar4 = *(long *)((long)stack + (ulong)(uVar2 >> 0xc & 0xf) * 8 + 8) << 4 ^ uVar5 << 8 ^
          *(ulong *)((long)stack + (ulong)(uVar2 >> 8 & 0xf) * 8 + 8);
  uVar5 = uVar3 << 8 | uVar4 >> 0x38;
  c[1] = uVar4;
  c[2] = uVar5;
  uVar2 = (uint)(b[1] >> 0x20) ^ (uint)(*b >> 0x20);
  uVar4 = *(long *)((long)stack + (ulong)(uVar2 >> 4 & 0xf) * 8 + 8) << 4 ^ uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)(uVar2 & 0xf) * 8 + 8);
  c[1] = uVar4;
  uVar5 = uVar5 << 8 | uVar4 >> 0x38;
  c[2] = uVar5;
  uVar2 = (uint)b[1] ^ (uint)*b;
  uVar4 = *(long *)((long)stack + (ulong)(uVar2 >> 0x1c) * 8 + 8) << 4 ^ uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)(uVar2 >> 0x15 & 0x78) + 8);
  uVar5 = uVar5 << 8 | uVar4 >> 0x38;
  c[1] = uVar4;
  c[2] = uVar5;
  uVar2 = (uint)b[1] ^ (uint)*b;
  uVar4 = *(long *)((long)stack + (ulong)(uVar2 >> 0x11 & 0x78) + 8) << 4 ^ uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)(uVar2 >> 0xd & 0x78) + 8);
  c[1] = uVar4;
  uVar3 = uVar5 << 8 | uVar4 >> 0x38;
  c[2] = uVar3;
  uVar2 = (uint)b[1] ^ (uint)*b;
  uVar5 = *(long *)((long)stack + (ulong)(uVar2 >> 9 & 0x78) + 8) << 4 ^ uVar4 << 8 ^
          *(ulong *)((long)stack + (ulong)(uVar2 >> 5 & 0x78) + 8);
  c[1] = uVar5;
  uVar4 = uVar3 << 8 | uVar5 >> 0x38;
  c[2] = uVar4;
  uVar2 = (uint)b[1] ^ (uint)*b;
  uVar5 = *(long *)((long)stack + (ulong)(uVar2 >> 1 & 0x78) + 8) << 4 ^ uVar5 << 8 ^
          *(ulong *)((long)stack + (ulong)(uVar2 & 0xf) * 8 + 8);
  c[1] = uVar5;
  uVar4 = (long)(a[1] ^ *a) >> 0x3f & (b[1] ^ *b) >> 1 & 0x7f7f7f7f7f7f7f7f ^ uVar4;
  c[2] = uVar4;
  uVar4 = (b[1] ^ *b) >> 2 & 0x3f3f3f3f3f3f3f3f & (long)((a[1] ^ *a) * 2) >> 0x3f ^ uVar4;
  c[2] = uVar4;
  uVar4 = (b[1] ^ *b) >> 3 & 0x1f1f1f1f1f1f1f1f & (long)((a[1] ^ *a) << 2) >> 0x3f ^ uVar4;
  c[2] = uVar4;
  uVar4 = (b[1] ^ *b) >> 4 & 0xf0f0f0f0f0f0f0f & (long)((a[1] ^ *a) << 3) >> 0x3f ^ uVar4;
  c[2] = uVar4;
  uVar4 = (b[1] ^ *b) >> 5 & 0x707070707070707 & (long)((a[1] ^ *a) << 4) >> 0x3f ^ uVar4;
  c[2] = uVar4;
  uVar4 = (b[1] ^ *b) >> 6 & 0x303030303030303 & (long)((a[1] ^ *a) << 5) >> 0x3f ^ uVar4;
  c[2] = uVar4;
  uVar4 = (b[1] ^ *b) >> 7 & 0x101010101010101 & (long)((a[1] ^ *a) << 6) >> 0x3f ^ uVar4;
  c[2] = uVar4;
  c[1] = *c ^ *stack ^ uVar5;
  c[2] = c[3] ^ *stack ^ uVar4;
  return;
}

Assistant:

static void ppMul2(word c[4], const word a[2], const word b[2], void* stack)
{
	word* t = (word*)stack;
	ASSERT(wwIsDisjoint2(a, 2, c, 4));
	ASSERT(wwIsDisjoint2(b, 2, c, 4));
	// c1 || c0 <- a0 b0
	_MUL1(c, a[0], b[0], t);
	// c3 || c2 <- a1 b1
	_MUL1(c + 2, a[1], b[1], t);
	// t0 <- c1 + c2
	t[0] = c[1] ^ c[2];
	// с2 || с1 <- (a0 + a1)(b0 + b1)
	_MUL1(c + 1, a[0] ^ a[1], b[0] ^ b[1], t + 1);
	// c1 <- c1 + c0 + w2
	c[1] ^= c[0] ^ t[0];
	// c2 <- c2 + c3 + w2
	c[2] ^= c[3] ^ t[0];
}